

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  size_t *psVar1;
  TestCaseInfo *pTVar2;
  IStreamingReporter *pIVar3;
  pointer pcVar4;
  IRunContext *_runContext;
  Totals deltaTotals;
  SectionInfo testCaseSection;
  Counts assertions;
  SectionStats testCaseSectionStats;
  ResultBuilder resultBuilder;
  string local_5f8;
  string local_5d8;
  Totals local_5b8;
  SectionInfo local_588;
  undefined1 local_518 [8];
  _Alloc_hider local_510;
  undefined1 local_508 [24];
  undefined4 local_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  undefined4 local_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0 [19];
  Counts local_388;
  SectionStats local_370;
  ResultBuilder local_2d0;
  
  ResultBuilder::ResultBuilder
            (&local_2d0,&this->super_IRunContext,
             (this->m_lastAssertionInfo).macroName._M_dataplus._M_p,
             &(this->m_lastAssertionInfo).lineInfo,
             (this->m_lastAssertionInfo).capturedExpression._M_dataplus._M_p,
             (this->m_lastAssertionInfo).resultDisposition,"");
  local_2d0.m_data.resultType = FatalErrorCondition;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2d0.m_stream,(message->_M_dataplus)._M_p,message->_M_string_length);
  ResultBuilder::captureExpression(&local_2d0);
  handleUnfinishedSections(this);
  _runContext = getGlobalRunContext();
  pTVar2 = this->m_activeTestCaseInfo;
  SectionInfo::SectionInfo
            (&local_588,_runContext,&pTVar2->lineInfo,&pTVar2->name,&pTVar2->description);
  local_388.passed = 0;
  local_388.failedButOk = 0;
  local_388.failed = 1;
  SectionStats::SectionStats(&local_370,&local_588,&local_388,0.0,false);
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,&local_370);
  local_5b8.testCases.failedButOk = 0;
  local_5b8.assertions.failedButOk = 0;
  local_5b8.testCases.passed = 0;
  local_5b8.assertions.passed = 0;
  local_5b8.assertions.failed = 0;
  local_5b8.testCases.failed = 1;
  pIVar3 = (this->m_reporter).m_p;
  pTVar2 = this->m_activeTestCaseInfo;
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"");
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"");
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_518,pTVar2,&local_5b8,&local_5d8,&local_5f8,false);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,local_518);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  local_518 = (undefined1  [8])local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"");
  testGroupEnded(this,(string *)local_518,&this->m_totals,1,1);
  if (local_518 != (undefined1  [8])local_508) {
    operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
  }
  pIVar3 = (this->m_reporter).m_p;
  local_518 = (undefined1  [8])&PTR__TestRunStats_00166e40;
  pcVar4 = (this->m_runInfo).name._M_dataplus._M_p;
  local_510._M_p = local_508 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_510,pcVar4,pcVar4 + (this->m_runInfo).name._M_string_length);
  local_4f0 = (undefined4)(this->m_totals).assertions.passed;
  uStack_4ec = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  uStack_4e8 = (undefined4)(this->m_totals).assertions.failed;
  uStack_4e4 = *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  local_4e0._M_allocated_capacity._0_4_ = (undefined4)(this->m_totals).assertions.failedButOk;
  local_4e0._M_allocated_capacity._4_4_ =
       *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  local_4e0._8_4_ = (undefined4)(this->m_totals).testCases.passed;
  local_4e0._12_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  local_4d0 = (undefined4)(this->m_totals).testCases.failed;
  uStack_4cc = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  uStack_4c8 = (undefined4)(this->m_totals).testCases.failedButOk;
  uStack_4c4 = *(undefined4 *)((long)&(this->m_totals).testCases.failedButOk + 4);
  local_4c0[0]._M_local_buf[0] = '\0';
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar3);
  local_518 = (undefined1  [8])&PTR__TestRunStats_00166e40;
  if (local_510._M_p != local_508 + 8) {
    operator_delete(local_510._M_p,local_508._8_8_ + 1);
  }
  SectionStats::~SectionStats(&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588.lineInfo.file._M_dataplus._M_p != &local_588.lineInfo.file.field_2) {
    operator_delete(local_588.lineInfo.file._M_dataplus._M_p,
                    local_588.lineInfo.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588.description._M_dataplus._M_p != &local_588.description.field_2) {
    operator_delete(local_588.description._M_dataplus._M_p,
                    local_588.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588.name._M_dataplus._M_p != &local_588.name.field_2) {
    operator_delete(local_588.name._M_dataplus._M_p,local_588.name.field_2._M_allocated_capacity + 1
                   );
  }
  ResultBuilder::~ResultBuilder(&local_2d0);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) CATCH_OVERRIDE {
            ResultBuilder resultBuilder = makeUnexpectedResultBuilder();
            resultBuilder.setResultType( ResultWas::FatalErrorCondition );
            resultBuilder << message;
            resultBuilder.captureExpression();

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            SectionInfo testCaseSection
                (   C_A_T_C_H_Context(),
                    m_activeTestCaseInfo->lineInfo,
                    m_activeTestCaseInfo->name,
                    m_activeTestCaseInfo->description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   *m_activeTestCaseInfo,
                                                        deltaTotals,
                                                        "",
                                                        "",
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( "", m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }